

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Performance::anon_unknown_1::UploadWaitDrawCase::init
          (UploadWaitDrawCase *this,EVP_PKEY_CTX *ctx)

{
  ostringstream *poVar1;
  int *this_00;
  TargetBuffer TVar2;
  uint uVar3;
  UploadMethod UVar4;
  pointer pVVar5;
  pointer puVar6;
  pointer pSVar7;
  pointer pRVar8;
  int iVar9;
  undefined4 extraout_var;
  RenderTarget *pRVar10;
  allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample> *paVar11;
  pointer __dest;
  ulong uVar12;
  long lVar13;
  pointer __dest_00;
  MessageBuilder *this_01;
  NotSupportedError *this_02;
  int iVar14;
  Sample *pSVar15;
  int numBytes;
  allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample> *paVar16;
  allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample>
  *extraout_RDX;
  size_t __n;
  size_t extraout_RDX_00;
  allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Result>
  *extraout_RDX_01;
  size_t __n_00;
  Result *pRVar17;
  char *pcVar18;
  int iVar19;
  ulong uVar20;
  int iVar21;
  long lVar22;
  Sample *pSVar23;
  Result *pRVar24;
  allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample> *__n_01;
  ulong __n_02;
  bool bVar25;
  LayeredGridSpec scene_1;
  int local_240 [2];
  string local_238;
  string local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  LayeredGridSpec scene;
  undefined4 uStack_1ac;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [23];
  
  iVar9 = (*((this->super_RenderPerformanceTestBase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  lVar22 = CONCAT44(extraout_var,iVar9);
  TVar2 = this->m_targetBuffer;
  RenderPerformanceTestBase::init(&this->super_RenderPerformanceTestBase,ctx);
  pRVar10 = Context::getRenderTarget
                      ((this->super_RenderPerformanceTestBase).super_TestCase.m_context);
  if ((pRVar10->m_width < 0x80) ||
     (pRVar10 = Context::getRenderTarget
                          ((this->super_RenderPerformanceTestBase).super_TestCase.m_context),
     pRVar10->m_height < 0x80)) {
    this_02 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    local_240[1] = 0x80;
    de::toString<int>(&local_218,local_240 + 1);
    std::operator+(&local_1f8,"Test case requires ",&local_218);
    std::operator+(&local_1d8,&local_1f8,"x");
    local_240[0] = 0x80;
    de::toString<int>(&local_238,local_240);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&scene_1,
                   &local_1d8,&local_238);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&scene,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&scene_1,
                   " render target");
    tcu::NotSupportedError::NotSupportedError(this_02,(string *)&scene);
    __cxa_throw(this_02,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  (**(code **)(lVar22 + 0x1a00))(0,0,0x80,0x80);
  (**(code **)(lVar22 + 0x120))(0x302,0x303);
  (**(code **)(lVar22 + 0x100))(0x8006);
  (**(code **)(lVar22 + 0x5e0))(0xbe2);
  scene.gridWidth = 0x5d;
  scene.gridHeight = 0x5d;
  stack0xfffffffffffffe50 = (ObjectTraits *)CONCAT44(uStack_1ac,5);
  generateLayeredGridVertexAttribData4C4V(&this->m_vertexData,&scene);
  generateLayeredGridIndexData(&this->m_indexData,&scene);
  this->m_numVertices = 0x3f58e;
  if (this->m_bufferState == BUFFERSTATE_EXISTING) {
    (**(code **)(lVar22 + 0x6c8))(1,&this->m_vertexBuffer);
    (**(code **)(lVar22 + 0x40))(0x8892,this->m_vertexBuffer);
    pVVar5 = (this->m_vertexData).
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    (**(code **)(lVar22 + 0x150))
              (0x8892,(long)(this->m_vertexData).
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar5,pVVar5,0x88e4)
    ;
    if (this->m_drawMethod == DRAWMETHOD_DRAW_ELEMENTS) {
      (**(code **)(lVar22 + 0x6c8))(1,&this->m_indexBuffer);
      (**(code **)(lVar22 + 0x40))(0x8893,this->m_indexBuffer);
      puVar6 = (this->m_indexData).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      (**(code **)(lVar22 + 0x150))
                (0x8893,(long)(this->m_indexData).
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)puVar6,puVar6,0x88e4
                );
    }
    RenderPerformanceTestBase::setupVertexAttribs(&this->super_RenderPerformanceTestBase);
    if (this->m_drawMethod == DRAWMETHOD_DRAW_ELEMENTS) {
      (**(code **)(lVar22 + 0x568))(4,this->m_numVertices,0x1405,0);
    }
    else if (this->m_drawMethod == DRAWMETHOD_DRAW_ARRAYS) goto LAB_011910f0;
  }
  else if ((this->m_bufferState == BUFFERSTATE_NEW) &&
          (this->m_drawMethod == DRAWMETHOD_DRAW_ELEMENTS)) {
    if (this->m_targetBuffer == TARGETBUFFER_INDEX) {
      (**(code **)(lVar22 + 0x6c8))(1,&this->m_vertexBuffer);
      (**(code **)(lVar22 + 0x40))(0x8892,this->m_vertexBuffer);
      pVVar5 = (this->m_vertexData).
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      (**(code **)(lVar22 + 0x150))
                (0x8892,(long)(this->m_vertexData).
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar5,pVVar5,
                 0x88e4);
      RenderPerformanceTestBase::setupVertexAttribs(&this->super_RenderPerformanceTestBase);
LAB_011910f0:
      (**(code **)(lVar22 + 0x538))(4,0,this->m_numVertices);
    }
    else if (this->m_targetBuffer == TARGETBUFFER_VERTEX) {
      glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
                ((TypedObjectWrapper<(glu::ObjectType)1> *)&scene,
                 ((this->super_RenderPerformanceTestBase).super_TestCase.m_context)->m_renderCtx);
      (**(code **)(lVar22 + 0x6c8))(1,&this->m_indexBuffer);
      (**(code **)(lVar22 + 0x40))(0x8892,(undefined4)local_1a8[0]._M_allocated_capacity);
      (**(code **)(lVar22 + 0x40))(0x8893,this->m_indexBuffer);
      pVVar5 = (this->m_vertexData).
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      (**(code **)(lVar22 + 0x150))
                (0x8892,(long)(this->m_vertexData).
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar5,pVVar5,
                 0x88e4);
      puVar6 = (this->m_indexData).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      (**(code **)(lVar22 + 0x150))
                (0x8893,(long)(this->m_indexData).
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)puVar6,puVar6,0x88e4
                );
      RenderPerformanceTestBase::setupVertexAttribs(&this->super_RenderPerformanceTestBase);
      (**(code **)(lVar22 + 0x568))(4,this->m_numVertices,0x1405,0);
      glu::ObjectWrapper::~ObjectWrapper((ObjectWrapper *)&scene);
    }
  }
  scene.gridWidth = 0;
  scene.gridHeight = 0;
  stack0xfffffffffffffe50 = (ObjectTraits *)0x0;
  scene_1.gridWidth = 0x28;
  scene_1.gridHeight = 0x28;
  scene_1.gridLayers = 5;
  generateLayeredGridVertexAttribData4C4V
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&scene,
             &scene_1);
  (**(code **)(lVar22 + 0x6c8))(1,&this->m_miscBuffer);
  (**(code **)(lVar22 + 0x40))(0x8892,this->m_miscBuffer);
  (**(code **)(lVar22 + 0x150))
            (0x8892,(long)stack0xfffffffffffffe50 - scene._0_8_,scene._0_8_,0x88e4);
  this->m_numMiscVertices = 48000;
  std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
            ((_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&scene)
  ;
  paVar16 = (allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample>
             *)(long)((this->m_numMaxSwaps + 1) * this->m_numSamplesPerSwap);
  pSVar23 = (this->m_samples).
            super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  pSVar7 = (this->m_samples).
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar22 = (long)pSVar23 - (long)pSVar7;
  paVar11 = (allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample>
             *)(lVar22 >> 4);
  __n_01 = paVar16 + -(long)paVar11;
  if (paVar16 < paVar11 ||
      __n_01 == (allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample>
                 *)0x0) {
    if ((paVar16 < paVar11) && (pSVar15 = pSVar7 + (long)paVar16, pSVar23 != pSVar15)) {
      (this->m_samples).
      super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample>_>
      ._M_impl.super__Vector_impl_data._M_finish = pSVar15;
    }
  }
  else if ((allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample> *
           )((long)(this->m_samples).
                   super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pSVar23 >> 4) < __n_01
          ) {
    if ((allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample> *)
        ((ulong)paVar11 ^ 0x7ffffffffffffff) < __n_01) goto LAB_01191719;
    paVar16 = __n_01;
    if (__n_01 < paVar11) {
      paVar16 = paVar11;
    }
    paVar16 = paVar16 + (long)paVar11;
    if ((allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample> *)
        0x7fffffffffffffe < paVar16) {
      paVar16 = (allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample>
                 *)0x7ffffffffffffff;
    }
    __dest = (pointer)operator_new((long)paVar16 * 0x10);
    pSVar23 = (Sample *)(lVar22 + (long)__dest);
    std::
    __uninitialized_default_n_a<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample*,unsigned_long,deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample>
              (pSVar23,(unsigned_long)__n_01,extraout_RDX);
    pSVar7 = (this->m_samples).
             super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample>_>
             ._M_impl.super__Vector_impl_data._M_start;
    __n = (long)(this->m_samples).
                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar7;
    if (0 < (long)__n) {
      memmove(__dest,pSVar7,__n);
      __n = extraout_RDX_00;
    }
    std::
    _Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample>_>
    ::_M_deallocate((_Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample>_>
                     *)pSVar7,
                    (pointer)((long)(this->m_samples).
                                    super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)pSVar7 >> 4),__n);
    (this->m_samples).
    super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample>_>
    ._M_impl.super__Vector_impl_data._M_start = __dest;
    (this->m_samples).
    super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample>_>
    ._M_impl.super__Vector_impl_data._M_finish = pSVar23 + (long)__n_01;
    (this->m_samples).
    super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = __dest + (long)paVar16;
  }
  else {
    pSVar23 = std::
              __uninitialized_default_n_a<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample*,unsigned_long,deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample>
                        (pSVar23,(unsigned_long)__n_01,paVar16);
    (this->m_samples).
    super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample>_>
    ._M_impl.super__Vector_impl_data._M_finish = pSVar23;
  }
  uVar20 = (ulong)((this->m_numMaxSwaps + 1) * this->m_numSamplesPerSwap);
  pRVar24 = (this->m_results).
            super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Result,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Result>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  pRVar8 = (this->m_results).
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Result,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Result>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar22 = (long)pRVar24 - (long)pRVar8;
  uVar12 = lVar22 / 0x28;
  __n_02 = uVar20 - uVar12;
  if (uVar20 < uVar12 || __n_02 == 0) {
    if ((uVar20 < uVar12) && (pRVar17 = pRVar8 + uVar20, pRVar24 != pRVar17)) {
      (this->m_results).
      super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Result,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Result>_>
      ._M_impl.super__Vector_impl_data._M_finish = pRVar17;
    }
  }
  else {
    lVar13 = (long)(this->m_results).
                   super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Result,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Result>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pRVar24;
    if ((ulong)(lVar13 / 0x28) < __n_02) {
      if (0x333333333333333 - uVar12 < __n_02) {
LAB_01191719:
        std::__throw_length_error("vector::_M_default_append");
      }
      uVar20 = __n_02;
      if (__n_02 < uVar12) {
        uVar20 = uVar12;
      }
      uVar20 = uVar20 + uVar12;
      if (0x333333333333332 < uVar20) {
        uVar20 = 0x333333333333333;
      }
      __dest_00 = (pointer)operator_new(uVar20 * 0x28);
      pRVar24 = (Result *)(lVar22 + (long)__dest_00);
      std::
      __uninitialized_default_n_a<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Result*,unsigned_long,deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Result>
                (pRVar24,__n_02,extraout_RDX_01);
      pRVar8 = (this->m_results).
               super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Result,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Result>_>
               ._M_impl.super__Vector_impl_data._M_start;
      __n_00 = (long)(this->m_results).
                     super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Result,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Result>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar8;
      if (0 < (long)__n_00) {
        memmove(__dest_00,pRVar8,__n_00);
      }
      lVar22 = (long)(this->m_results).
                     super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Result,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Result>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pRVar8;
      std::
      _Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Result,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Result>_>
      ::_M_deallocate((_Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Result,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Result>_>
                       *)pRVar8,(pointer)(lVar22 / 0x28),lVar22 % 0x28);
      (this->m_results).
      super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Result,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Result>_>
      ._M_impl.super__Vector_impl_data._M_start = __dest_00;
      (this->m_results).
      super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Result,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Result>_>
      ._M_impl.super__Vector_impl_data._M_finish = pRVar24 + __n_02;
      (this->m_results).
      super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Result,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Result>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = __dest_00 + uVar20;
    }
    else {
      pRVar24 = std::
                __uninitialized_default_n_a<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Result*,unsigned_long,deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Result>
                          (pRVar24,__n_02,
                           (allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Result>
                            *)(lVar13 % 0x28));
      (this->m_results).
      super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Result,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Result>_>
      ._M_impl.super__Vector_impl_data._M_finish = pRVar24;
    }
  }
  uVar3 = this->m_numSamplesPerSwap;
  iVar9 = 0;
  uVar12 = 0;
  if (0 < (int)uVar3) {
    uVar12 = (ulong)uVar3;
  }
  iVar14 = this->m_numMaxSwaps + 1;
  if (iVar14 < 1) {
    iVar14 = 0;
  }
  for (iVar19 = 0; iVar19 != iVar14; iVar19 = iVar19 + 1) {
    pSVar7 = (this->m_samples).
             super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar20 = uVar12;
    iVar21 = iVar9;
    while (bVar25 = uVar20 != 0, uVar20 = uVar20 - 1, bVar25) {
      pSVar7[iVar21].numFrames = iVar19;
      iVar21 = iVar21 + 1;
    }
    iVar9 = iVar9 + uVar3;
  }
  std::vector<int,_std::allocator<int>_>::resize
            (&this->m_iterationOrder,
             (long)(this->m_samples).
                   super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->m_samples).
                   super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4);
  generateTwoPassRandomIterationOrder
            (&this->m_iterationOrder,
             (int)((ulong)((long)(this->m_samples).
                                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->m_samples).
                                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 4));
  scene._0_8_ = ((this->super_RenderPerformanceTestBase).super_TestCase.super_TestCase.
                 super_TestNode.m_testCtx)->m_log;
  this_00 = &scene.gridLayers;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
  std::operator<<((ostream *)this_00,"Measuring time used in ");
  pcVar18 = "Draw method: drawElements";
  if (this->m_drawMethod == DRAWMETHOD_DRAW_ARRAYS) {
    pcVar18 = "Draw method: drawArrays";
  }
  std::operator<<((ostream *)this_00,pcVar18 + 0xd);
  std::operator<<((ostream *)this_00," and readPixels call.\n");
  std::operator<<((ostream *)this_00,
                  "Drawing using a buffer that has been uploaded N frames ago. Testing with N within range [0, "
                 );
  this_01 = tcu::MessageBuilder::operator<<((MessageBuilder *)&scene,&this->m_numMaxSwaps);
  poVar1 = &this_01->m_str;
  std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"].\n");
  std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                  "Uploaded buffer is a ");
  pcVar18 = "index";
  if (this->m_targetBuffer == TARGETBUFFER_VERTEX) {
    pcVar18 = "vertex attribute";
  }
  std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,pcVar18);
  std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>," buffer.\n");
  std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"Uploading using ");
  UVar4 = this->m_uploadMethod;
  if (UVar4 == UPLOADMETHOD_BUFFER_DATA) {
    pcVar18 = "bufferData";
  }
  else if (UVar4 == UPLOADMETHOD_BUFFER_SUB_DATA) {
    pcVar18 = "bufferSubData";
  }
  else {
    pcVar18 = (char *)0x0;
    if (UVar4 == UPLOADMETHOD_MAP_BUFFER_RANGE) {
      pcVar18 = 
      "mapBufferRange, flags = GL_MAP_WRITE_BIT | GL_MAP_INVALIDATE_BUFFER_BIT | GL_MAP_UNSYNCHRONIZED_BIT"
      ;
    }
  }
  std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,pcVar18);
  std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"\n");
  std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"Upload size is ");
  Performance::(anonymous_namespace)::getHumanReadableByteSize_abi_cxx11_
            ((string *)&scene_1,
             (_anonymous_namespace_ *)
             (ulong)(uint)(this->m_numVertices << (TVar2 == TARGETBUFFER_VERTEX) * '\x03' + 2),
             numBytes);
  std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,(string *)&scene_1);
  std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,".\n");
  pcVar18 = glcts::fixed_sample_locations_values + 1;
  if (this->m_bufferState == BUFFERSTATE_EXISTING) {
    pcVar18 = "All test samples use the same buffer object.\n";
  }
  std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,pcVar18);
  std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                  "Test result is the number of frames (swaps) required for the render time to stabilize.\n"
                 );
  std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                  "Assuming combined time used in the draw call and readPixels call is stabilizes to a constant value.\n"
                 );
  tcu::MessageBuilder::operator<<(this_01,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::string::~string((string *)&scene_1);
  iVar9 = std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
  return iVar9;
}

Assistant:

void UploadWaitDrawCase::init (void)
{
	const glw::Functions&	gl						= m_context.getRenderContext().getFunctions();
	const int				vertexAttribSize		= (int)sizeof(tcu::Vec4) * 2; // color4, position4
	const int				vertexIndexSize			= (int)sizeof(deUint32);
	const int				vertexUploadDataSize	= (m_targetBuffer == TARGETBUFFER_VERTEX) ? (vertexAttribSize) : (vertexIndexSize);

	RenderPerformanceTestBase::init();

	// requirements

	if (m_context.getRenderTarget().getWidth() < RENDER_AREA_SIZE ||
		m_context.getRenderTarget().getHeight() < RENDER_AREA_SIZE)
		throw tcu::NotSupportedError("Test case requires " + de::toString<int>(RENDER_AREA_SIZE) + "x" + de::toString<int>(RENDER_AREA_SIZE) + " render target");

	// gl state

	gl.viewport(0, 0, RENDER_AREA_SIZE, RENDER_AREA_SIZE);

	// enable bleding to prevent grid layers from being discarded

	gl.blendFunc(GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA);
	gl.blendEquation(GL_FUNC_ADD);
	gl.enable(GL_BLEND);

	// scene

	{
		LayeredGridSpec scene;

		// create ~8MB workload with similar characteristics as in the other test
		// => makes comparison to other results more straightforward
		scene.gridWidth = 93;
		scene.gridHeight = 93;
		scene.gridLayers = 5;

		generateLayeredGridVertexAttribData4C4V(m_vertexData, scene);
		generateLayeredGridIndexData(m_indexData, scene);
		m_numVertices = getLayeredGridNumVertices(scene);
	}

	// buffers

	if (m_bufferState == BUFFERSTATE_NEW)
	{
		if (m_drawMethod == DRAWMETHOD_DRAW_ELEMENTS)
		{
			// reads from two buffers, prepare the static buffer

			if (m_targetBuffer == TARGETBUFFER_VERTEX)
			{
				// index buffer is static, use another vertex buffer to keep original buffer in unused state
				const glu::Buffer vertexCopyBuffer(m_context.getRenderContext());

				gl.genBuffers(1, &m_indexBuffer);
				gl.bindBuffer(GL_ARRAY_BUFFER, *vertexCopyBuffer);
				gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_indexBuffer);
				gl.bufferData(GL_ARRAY_BUFFER, (glw::GLsizeiptr)(m_vertexData.size() * sizeof(tcu::Vec4)), &m_vertexData[0], GL_STATIC_DRAW);
				gl.bufferData(GL_ELEMENT_ARRAY_BUFFER, (glw::GLsizeiptr)(m_indexData.size() * sizeof(deUint32)), &m_indexData[0], GL_STATIC_DRAW);

				setupVertexAttribs();
				gl.drawElements(GL_TRIANGLES, m_numVertices, GL_UNSIGNED_INT, DE_NULL);
			}
			else if (m_targetBuffer == TARGETBUFFER_INDEX)
			{
				// vertex buffer is static
				gl.genBuffers(1, &m_vertexBuffer);
				gl.bindBuffer(GL_ARRAY_BUFFER, m_vertexBuffer);
				gl.bufferData(GL_ARRAY_BUFFER, (glw::GLsizeiptr)(m_vertexData.size() * sizeof(tcu::Vec4)), &m_vertexData[0], GL_STATIC_DRAW);

				setupVertexAttribs();
				gl.drawArrays(GL_TRIANGLES, 0, m_numVertices);
			}
			else
				DE_ASSERT(false);
		}
	}
	else if (m_bufferState == BUFFERSTATE_EXISTING)
	{
		const glw::GLenum vertexUsage	= (m_targetBuffer == TARGETBUFFER_VERTEX) ? (GL_STATIC_DRAW) : (GL_STATIC_DRAW);
		const glw::GLenum indexUsage	= (m_targetBuffer == TARGETBUFFER_INDEX) ? (GL_STATIC_DRAW) : (GL_STATIC_DRAW);

		gl.genBuffers(1, &m_vertexBuffer);
		gl.bindBuffer(GL_ARRAY_BUFFER, m_vertexBuffer);
		gl.bufferData(GL_ARRAY_BUFFER, (glw::GLsizeiptr)(m_vertexData.size() * sizeof(tcu::Vec4)), &m_vertexData[0], vertexUsage);

		if (m_drawMethod == DRAWMETHOD_DRAW_ELEMENTS)
		{
			gl.genBuffers(1, &m_indexBuffer);
			gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_indexBuffer);
			gl.bufferData(GL_ELEMENT_ARRAY_BUFFER, (glw::GLsizeiptr)(m_indexData.size() * sizeof(deUint32)), &m_indexData[0], indexUsage);
		}

		setupVertexAttribs();

		if (m_drawMethod == DRAWMETHOD_DRAW_ARRAYS)
			gl.drawArrays(GL_TRIANGLES, 0, m_numVertices);
		else if (m_drawMethod == DRAWMETHOD_DRAW_ELEMENTS)
			gl.drawElements(GL_TRIANGLES, m_numVertices, GL_UNSIGNED_INT, DE_NULL);
		else
			DE_ASSERT(false);
	}
	else
		DE_ASSERT(false);

	// misc draw buffer
	{
		std::vector<tcu::Vec4>	vertexData;
		LayeredGridSpec			scene;

		// create ~1.5MB workload with similar characteristics
		scene.gridWidth = 40;
		scene.gridHeight = 40;
		scene.gridLayers = 5;

		generateLayeredGridVertexAttribData4C4V(vertexData, scene);

		gl.genBuffers(1, &m_miscBuffer);
		gl.bindBuffer(GL_ARRAY_BUFFER, m_miscBuffer);
		gl.bufferData(GL_ARRAY_BUFFER, (glw::GLsizeiptr)(sizeof(tcu::Vec4) * vertexData.size()), &vertexData[0], GL_STATIC_DRAW);

		m_numMiscVertices = getLayeredGridNumVertices(scene);
	}

	// iterations
	{
		m_samples.resize((m_numMaxSwaps+1) * m_numSamplesPerSwap);
		m_results.resize((m_numMaxSwaps+1) * m_numSamplesPerSwap);

		for (int numSwaps = 0; numSwaps <= m_numMaxSwaps; ++numSwaps)
		for (int sampleNdx = 0; sampleNdx < m_numSamplesPerSwap; ++sampleNdx)
		{
			const int index = numSwaps*m_numSamplesPerSwap + sampleNdx;

			m_samples[index].numFrames = numSwaps;
		}

		m_iterationOrder.resize(m_samples.size());
		generateTwoPassRandomIterationOrder(m_iterationOrder, (int)m_samples.size());
	}

	// log
	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Measuring time used in " << ((m_drawMethod == DRAWMETHOD_DRAW_ARRAYS) ? ("drawArrays") : ("drawElements")) << " and readPixels call.\n"
		<< "Drawing using a buffer that has been uploaded N frames ago. Testing with N within range [0, " << m_numMaxSwaps << "].\n"
		<< "Uploaded buffer is a " << ((m_targetBuffer == TARGETBUFFER_VERTEX) ? ("vertex attribute") : ("index")) << " buffer.\n"
		<< "Uploading using "
			<< ((m_uploadMethod == UPLOADMETHOD_BUFFER_DATA)		? ("bufferData")																							:
				(m_uploadMethod == UPLOADMETHOD_BUFFER_SUB_DATA)	? ("bufferSubData")																							:
				(m_uploadMethod == UPLOADMETHOD_MAP_BUFFER_RANGE)	? ("mapBufferRange, flags = GL_MAP_WRITE_BIT | GL_MAP_INVALIDATE_BUFFER_BIT | GL_MAP_UNSYNCHRONIZED_BIT")	:
				((const char*)DE_NULL))
			<< "\n"
		<< "Upload size is " << getHumanReadableByteSize(m_numVertices * vertexUploadDataSize) << ".\n"
		<< ((m_bufferState == BUFFERSTATE_EXISTING) ? ("All test samples use the same buffer object.\n") : (""))
		<< "Test result is the number of frames (swaps) required for the render time to stabilize.\n"
		<< "Assuming combined time used in the draw call and readPixels call is stabilizes to a constant value.\n"
		<< tcu::TestLog::EndMessage;
}